

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O2

void __thiscall
duckdb::HivePartitionedColumnData::ComputePartitionIndices
          (HivePartitionedColumnData *this,PartitionedColumnDataAppendState *state,DataChunk *input)

{
  idx_t count;
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  reference pvVar3;
  reference input_00;
  reference __k;
  iterator iVar4;
  idx_t iVar5;
  idx_t col_idx;
  ulong __n;
  size_type __n_00;
  HivePartitionKey local_50;
  
  count = input->count;
  DataChunk::Hash(input,&this->group_by_columns,&this->hashes_v);
  Vector::Flatten(&this->hashes_v,count);
  for (__n = 0; __n < (ulong)((long)(this->group_by_columns).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->group_by_columns).
                                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar3 = vector<unsigned_long,_true>::get<true>(&this->group_by_columns,__n);
    input_00 = vector<duckdb::Vector,_true>::get<true>(&input->data,*pvVar3);
    GetHivePartitionValuesTypeSwitch(input_00,&this->keys,__n,count);
  }
  pdVar1 = (this->hashes_v).data;
  pdVar2 = (state->partition_indices).data;
  for (__n_00 = 0; count != __n_00; __n_00 = __n_00 + 1) {
    __k = vector<duckdb::HivePartitionKey,_true>::get<true>(&this->keys,__n_00);
    __k->hash = *(hash_t *)(pdVar1 + __n_00 * 8);
    iVar4 = std::
            _Hashtable<duckdb::HivePartitionKey,_std::pair<const_duckdb::HivePartitionKey,_unsigned_long>,_std::allocator<std::pair<const_duckdb::HivePartitionKey,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::HivePartitionKey::Equality,_duckdb::HivePartitionKey::Hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->local_partition_map)._M_h,__k);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_duckdb::HivePartitionKey,_unsigned_long>,_true>.
        _M_cur == (__node_type *)0x0) {
      HivePartitionKey::HivePartitionKey(&local_50,__k);
      iVar5 = RegisterNewPartition(this,&local_50,state);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_50);
    }
    else {
      iVar5 = *(idx_t *)((long)iVar4.
                               super__Node_iterator_base<std::pair<const_duckdb::HivePartitionKey,_unsigned_long>,_true>
                               ._M_cur + 0x28);
    }
    *(idx_t *)(pdVar2 + __n_00 * 8) = iVar5;
  }
  return;
}

Assistant:

void HivePartitionedColumnData::ComputePartitionIndices(PartitionedColumnDataAppendState &state, DataChunk &input) {
	const auto count = input.size();

	input.Hash(group_by_columns, hashes_v);
	hashes_v.Flatten(count);

	for (idx_t col_idx = 0; col_idx < group_by_columns.size(); col_idx++) {
		auto &group_by_col = input.data[group_by_columns[col_idx]];
		GetHivePartitionValuesTypeSwitch(group_by_col, keys, col_idx, count);
	}

	const auto hashes = FlatVector::GetData<hash_t>(hashes_v);
	const auto partition_indices = FlatVector::GetData<idx_t>(state.partition_indices);
	for (idx_t i = 0; i < count; i++) {
		auto &key = keys[i];
		key.hash = hashes[i];
		auto lookup = local_partition_map.find(key);
		if (lookup == local_partition_map.end()) {
			idx_t new_partition_id = RegisterNewPartition(key, state);
			partition_indices[i] = new_partition_id;
		} else {
			partition_indices[i] = lookup->second;
		}
	}
}